

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_FloatToString.h
# Opt level: O1

uint32_t __thiscall
choc::text::FloatToStringBuffer<double>::generateDigits
          (FloatToStringBuffer<double> *this,char *buffer,MantissaAndExponent upperBound,
          uint64_t mantissaDiff,uint64_t delta,int *K)

{
  ulong uVar1;
  uint32_t *puVar2;
  byte bVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  bool bVar16;
  
  uVar4 = upperBound._8_8_;
  bVar3 = -(char)upperBound.mantissa;
  uVar1 = 1L << (bVar3 & 0x3f);
  uVar10 = (ulong)buffer >> (bVar3 & 0x3f);
  uVar15 = (uint)uVar10;
  if (uVar15 < 1000) {
    iVar6 = 1;
    if (uVar15 < 10) goto LAB_001e8dcc;
    bVar16 = uVar15 < 100;
    iVar6 = 3;
  }
  else if (uVar15 < 1000000) {
    iVar6 = 4;
    if (uVar15 < 10000) goto LAB_001e8dcc;
    bVar16 = uVar15 < 100000;
    iVar6 = 6;
  }
  else if (uVar15 < 100000000) {
    bVar16 = uVar15 < 10000000;
    iVar6 = 8;
  }
  else {
    bVar16 = uVar15 < 1000000000;
    iVar6 = 10;
  }
  iVar6 = iVar6 - (uint)bVar16;
LAB_001e8dcc:
  uVar8 = (ulong)buffer & uVar1 - 1;
  uVar15 = 0;
  uVar14 = -uVar4;
  do {
    uVar13 = uVar10 & 0xffffffff;
    iVar12 = (int)uVar10;
    iVar6 = iVar6 + -1;
    uVar10 = uVar13;
    switch(iVar6) {
    case 0:
      uVar10 = 0;
      goto switchD_001e8e08_default;
    case 1:
      iVar5 = (int)(uVar13 / 10);
      iVar9 = (int)(uVar13 / 10) * 10;
      break;
    case 2:
      iVar5 = (int)(uVar13 / 100);
      iVar9 = (int)(uVar13 / 100) * 100;
      break;
    case 3:
      iVar5 = (int)(uVar13 / 1000);
      iVar9 = (int)(uVar13 / 1000) * 1000;
      break;
    case 4:
      iVar5 = (int)(uVar13 / 10000);
      iVar9 = (int)(uVar13 / 10000) * 10000;
      break;
    case 5:
      iVar5 = (int)((uVar13 >> 5) / 0xc35);
      iVar9 = (int)((uVar13 >> 5) / 0xc35) * 100000;
      break;
    case 6:
      iVar5 = (int)(uVar13 / 1000000);
      iVar9 = (int)(uVar13 / 1000000) * 1000000;
      break;
    case 7:
      iVar5 = (int)(uVar13 / 10000000);
      iVar9 = (int)(uVar13 / 10000000) * 10000000;
      break;
    case 8:
      iVar5 = (int)(uVar13 / 100000000);
      iVar9 = (int)(uVar13 / 100000000) * 100000000;
      break;
    default:
      goto switchD_001e8e08_default;
    }
    uVar10 = (ulong)(uint)(iVar12 - iVar9);
    iVar12 = iVar5;
switchD_001e8e08_default:
    if (iVar12 != 0 || uVar15 != 0) {
      uVar13 = (ulong)uVar15;
      uVar15 = uVar15 + 1;
      this->storage[uVar13] = (char)iVar12 + '0';
    }
    uVar13 = (uVar10 << (bVar3 & 0x3f)) + uVar8;
    if (mantissaDiff < uVar13) {
      bVar16 = true;
      if (iVar6 == 0) {
        puVar2 = powersOf10;
        iVar6 = 0;
        do {
          iVar12 = iVar6;
          uVar14 = mantissaDiff;
          uVar13 = uVar8 * 10 >> (bVar3 & 0x3f);
          if ((int)uVar13 != 0 || uVar15 != 0) {
            uVar11 = (ulong)uVar15;
            uVar15 = uVar15 + 1;
            this->storage[uVar11] = (char)uVar13 + '0';
          }
          mantissaDiff = uVar14 * 10;
          uVar8 = uVar8 * 10 & uVar1 - 1;
          puVar2 = puVar2 + 1;
          iVar6 = iVar12 + -1;
        } while (mantissaDiff <= uVar8);
        *(int *)delta = *(int *)delta + iVar6;
        if (iVar12 < -7) {
          uVar13 = 0;
        }
        else {
          uVar13 = *puVar2 * uVar4;
        }
        bVar16 = false;
        if (uVar1 <= mantissaDiff - uVar8) {
          uVar11 = uVar13 - uVar8;
          if (uVar13 < uVar8 || uVar11 == 0) goto LAB_001e906d;
          uVar7 = uVar1 + uVar8;
          uVar14 = uVar14 * 10 - uVar7;
          do {
            if ((uVar13 <= uVar7) && (uVar11 <= uVar7 - uVar13)) break;
            this->storage[uVar15 - 1] = this->storage[uVar15 - 1] + -1;
            bVar16 = uVar1 <= uVar14;
            uVar14 = uVar14 - uVar1;
            if (uVar13 <= uVar7) {
              uVar14 = (ulong)uVar15;
              goto LAB_001e907d;
            }
            uVar11 = uVar11 - uVar1;
            uVar7 = uVar7 + uVar1;
          } while (bVar16);
          goto LAB_001e9075;
        }
        uVar14 = (ulong)uVar15;
      }
    }
    else {
      *(int *)delta = *(int *)delta + iVar6;
      uVar14 = (ulong)powersOf10[iVar6] << (bVar3 & 0x3f);
      uVar11 = uVar4 - uVar13;
      if ((uVar4 < uVar13 || uVar11 == 0) || (mantissaDiff - uVar13 < uVar14)) {
LAB_001e906d:
        uVar14 = (ulong)uVar15;
      }
      else {
        uVar13 = uVar13 + uVar14;
        uVar7 = mantissaDiff - uVar13;
        do {
          if ((uVar4 <= uVar13) && (uVar11 <= -uVar4 + uVar13)) break;
          this->storage[uVar15 - 1] = this->storage[uVar15 - 1] + -1;
          bVar16 = uVar14 <= uVar7;
          uVar7 = uVar7 - uVar14;
          if (uVar4 <= uVar13) break;
          uVar11 = uVar11 - uVar14;
          uVar13 = uVar13 + uVar14;
        } while (bVar16);
LAB_001e9075:
        uVar14 = (ulong)uVar15;
      }
LAB_001e907d:
      bVar16 = false;
    }
    if (!bVar16) {
      return (uint32_t)uVar14;
    }
  } while( true );
}

Assistant:

static uint32_t generateDigits (char* buffer, MantissaAndExponent upperBound, uint64_t mantissaDiff, uint64_t delta, int& K)
    {
        uint32_t length = 0;
        const auto one = MantissaAndExponent { 1ull << -upperBound.exponent, upperBound.exponent };
        auto p1 = static_cast<uint32_t> (upperBound.mantissa >> -one.exponent);
        auto p2 = upperBound.mantissa & (one.mantissa - 1);
        auto numDigits = math::getNumDecimalDigits (p1);

        for (;;)
        {
            auto digit = p1;

            switch (--numDigits)
            {
                case 0:                           p1 = 0;              break;
                case 1:  digit /= powersOf10[1];  p1 %= powersOf10[1]; break;
                case 2:  digit /= powersOf10[2];  p1 %= powersOf10[2]; break;
                case 3:  digit /= powersOf10[3];  p1 %= powersOf10[3]; break;
                case 4:  digit /= powersOf10[4];  p1 %= powersOf10[4]; break;
                case 5:  digit /= powersOf10[5];  p1 %= powersOf10[5]; break;
                case 6:  digit /= powersOf10[6];  p1 %= powersOf10[6]; break;
                case 7:  digit /= powersOf10[7];  p1 %= powersOf10[7]; break;
                case 8:  digit /= powersOf10[8];  p1 %= powersOf10[8]; break;
                default: break;
            }

            writeDigitIfNotLeadingZero (buffer, length, digit);
            auto rest = p2 + (static_cast<uint64_t> (p1) << -one.exponent);

            if (rest <= delta)
            {
                K += numDigits;
                roundFinalDigit (buffer, length, delta, rest, static_cast<uint64_t> (powersOf10[numDigits]) << -one.exponent, mantissaDiff);
                return length;
            }

            if (numDigits == 0)
            {
                for (;;)
                {
                    delta *= 10;
                    p2 *= 10;
                    --numDigits;
                    writeDigitIfNotLeadingZero (buffer, length, static_cast<uint32_t> (p2 >> -one.exponent));
                    p2 &= one.mantissa - 1;

                    if (p2 < delta)
                    {
                        K += numDigits;
                        roundFinalDigit (buffer, length, delta, p2, one.mantissa, numDigits > -9 ? mantissaDiff * powersOf10[-numDigits] : 0);
                        return length;
                    }
                }
            }
        }
    }